

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

int __thiscall cmCTest::ExecuteTests(cmCTest *this)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  long lVar3;
  int iVar4;
  _Rb_tree_node_base *p_Var5;
  cmCTestGenericHandler *pcVar6;
  long *plVar7;
  undefined1 in_DL;
  undefined1 extraout_DL;
  string cwd;
  ostringstream cmCTestLog_msg;
  string local_1d8;
  long *local_1b8;
  long local_1a8 [2];
  undefined1 local_198 [376];
  
  if (this->RunConfigurationScript == true) {
    if (this->ExtraVerbose == true) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198,"* Extra verbosity turned on",0x1b);
      std::ios::widen((char)(ostringstream *)local_198 +
                      (char)*(_func_int **)(local_198._0_8_ + -0x18));
      std::ostream::put((char)local_198);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      Log(this,1,
          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
          ,0x89d,local_1d8._M_dataplus._M_p,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
      std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
    }
    p_Var5 = (this->TestingHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->TestingHandlers)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var5 != p_Var1) {
      bVar2 = this->ExtraVerbose;
      iVar4 = this->SubmitIndex;
      do {
        lVar3 = *(long *)(p_Var5 + 2);
        *(uint *)(lVar3 + 0x18) = (uint)bVar2;
        *(int *)(lVar3 + 0x90) = iVar4;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
      } while ((_Rb_tree_header *)p_Var5 != p_Var1);
    }
    pcVar6 = GetHandler(this,"script");
    pcVar6->HandlerVerbose = (uint)this->Verbose;
    pcVar6 = GetHandler(this,"script");
    iVar4 = (*pcVar6->_vptr_cmCTestGenericHandler[1])(pcVar6);
    if (iVar4 == 0) {
      return 0;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"running script failing returning: ",0x22);
    plVar7 = (long *)std::ostream::operator<<(local_198,iVar4);
    std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
    std::ostream::put((char)plVar7);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,0,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x8a9,local_1d8._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  }
  else {
    this->ExtraVerbose = this->Verbose;
    this->Verbose = true;
    p_Var5 = (this->TestingHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->TestingHandlers)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var5 != p_Var1) {
      iVar4 = this->SubmitIndex;
      do {
        lVar3 = *(long *)(p_Var5 + 2);
        *(undefined4 *)(lVar3 + 0x18) = 1;
        *(int *)(lVar3 + 0x90) = iVar4;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
        in_DL = extraout_DL;
      } while ((_Rb_tree_header *)p_Var5 != p_Var1);
    }
    cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
              (&local_1d8,(SystemTools *)0x1,(bool)in_DL);
    iVar4 = Initialize(this,local_1d8._M_dataplus._M_p,(cmCTestStartCommand *)0x0);
    if (iVar4 == 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198,"Problem initializing the dashboard.",0x23);
      std::ios::widen((char)(ostream *)local_198 + (char)*(_func_int **)(local_198._0_8_ + -0x18));
      std::ostream::put((char)local_198);
      std::ostream::flush();
      std::__cxx11::stringbuf::str();
      Log(this,6,
          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
          ,0x8bb,(char *)local_1b8,false);
      if (local_1b8 != local_1a8) {
        operator_delete(local_1b8,local_1a8[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
      std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
      iVar4 = 0xc;
    }
    else {
      iVar4 = ProcessSteps(this);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    if (iVar4 == 0) {
      return 0;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,"Running a test(s) failed returning : ",0x25);
  plVar7 = (long *)std::ostream::operator<<(local_198,iVar4);
  std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
  std::ostream::put((char)plVar7);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(this,0,
      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
      0x8c3,local_1d8._M_dataplus._M_p,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  return iVar4;
}

Assistant:

int cmCTest::ExecuteTests()
{
  int res;
  // call process directory
  if (this->RunConfigurationScript) {
    if (this->ExtraVerbose) {
      cmCTestLog(this, OUTPUT, "* Extra verbosity turned on" << std::endl);
    }
    cmCTest::t_TestingHandlers::iterator it;
    for (it = this->TestingHandlers.begin(); it != this->TestingHandlers.end();
         ++it) {
      it->second->SetVerbose(this->ExtraVerbose);
      it->second->SetSubmitIndex(this->SubmitIndex);
    }
    this->GetHandler("script")->SetVerbose(this->Verbose);
    res = this->GetHandler("script")->ProcessHandler();
    if (res != 0) {
      cmCTestLog(this, DEBUG,
                 "running script failing returning: " << res << std::endl);
    }

  } else {
    // What is this?  -V seems to be the same as -VV,
    // and Verbose is always on in this case
    this->ExtraVerbose = this->Verbose;
    this->Verbose = true;
    cmCTest::t_TestingHandlers::iterator it;
    for (it = this->TestingHandlers.begin(); it != this->TestingHandlers.end();
         ++it) {
      it->second->SetVerbose(this->Verbose);
      it->second->SetSubmitIndex(this->SubmitIndex);
    }
    std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
    if (!this->Initialize(cwd.c_str(), CM_NULLPTR)) {
      res = 12;
      cmCTestLog(this, ERROR_MESSAGE, "Problem initializing the dashboard."
                   << std::endl);
    } else {
      res = this->ProcessSteps();
    }
    this->Finalize();
  }
  if (res != 0) {
    cmCTestLog(this, DEBUG,
               "Running a test(s) failed returning : " << res << std::endl);
  }
  return res;
}